

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_base.h
# Opt level: O2

void __thiscall
sqlib::statement_base::bind_args<int,std::__cxx11::string>
          (statement_base *this,int n,int *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest)

{
  detail::bind_arg(this->m_prepared,n,arg);
  bind_args<std::__cxx11::string>(this,n + 1,rest);
  return;
}

Assistant:

void bind_args(int n, const A1& arg, const Rest&... rest) {
    detail::bind_arg(m_prepared, n, arg);
    bind_args(n+1, rest...);
  }